

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_SetChannelMask(PortMidiStream *stream,int mask)

{
  undefined4 local_24;
  PmError err;
  PmInternal *midi;
  int mask_local;
  PortMidiStream *stream_local;
  
  local_24 = pmNoData;
  if (stream == (PortMidiStream *)0x0) {
    local_24 = pmBadPtr;
  }
  else {
    *(int *)((long)stream + 0x3c) = mask;
  }
  return local_24;
}

Assistant:

PMEXPORT PmError Pm_SetChannelMask(PortMidiStream *stream, int mask)
{
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;

    if (midi == NULL)
        err = pmBadPtr;
    else
        midi->channel_mask = mask;

    return pm_errmsg(err);
}